

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O0

int bio_read(BIO *bio,char *buf,int size_)

{
  long *plVar1;
  long lVar2;
  bio_bio_st *local_50;
  size_t chunk;
  bio_bio_st *peer_b;
  bio_bio_st *b;
  size_t rest;
  size_t size;
  char *pcStack_20;
  int size__local;
  char *buf_local;
  BIO *bio_local;
  
  rest = (size_t)size_;
  BIO_clear_retry_flags(bio);
  if (bio->init == 0) {
    bio_local._4_4_ = 0;
  }
  else {
    plVar1 = (long *)bio->ptr;
    if (plVar1 == (long *)0x0) {
      __assert_fail("b != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x76,"int bio_read(BIO *, char *, int)");
    }
    if (*plVar1 == 0) {
      __assert_fail("b->peer != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x77,"int bio_read(BIO *, char *, int)");
    }
    lVar2 = *(long *)(*plVar1 + 0x28);
    if (lVar2 == 0) {
      __assert_fail("peer_b != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x79,"int bio_read(BIO *, char *, int)");
    }
    if (*(long *)(lVar2 + 0x28) == 0) {
      __assert_fail("peer_b->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x7a,"int bio_read(BIO *, char *, int)");
    }
    *(undefined8 *)(lVar2 + 0x30) = 0;
    if ((buf == (char *)0x0) || (rest == 0)) {
      bio_local._4_4_ = 0;
    }
    else if (*(long *)(lVar2 + 0x10) == 0) {
      if (*(int *)(lVar2 + 8) == 0) {
        BIO_set_retry_read(bio);
        if (*(ulong *)(lVar2 + 0x20) < rest) {
          *(undefined8 *)(lVar2 + 0x30) = *(undefined8 *)(lVar2 + 0x20);
        }
        else {
          *(size_t *)(lVar2 + 0x30) = rest;
        }
        bio_local._4_4_ = -1;
      }
      else {
        bio_local._4_4_ = 0;
      }
    }
    else {
      if (*(ulong *)(lVar2 + 0x10) < rest) {
        rest = *(size_t *)(lVar2 + 0x10);
      }
      b = (bio_bio_st *)rest;
      pcStack_20 = buf;
      if (rest == 0) {
        __assert_fail("rest > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                      ,0x9a,"int bio_read(BIO *, char *, int)");
      }
      do {
        if (*(bio_bio_st **)(lVar2 + 0x10) < b) {
          __assert_fail("rest <= peer_b->len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                        ,0x9f,"int bio_read(BIO *, char *, int)");
        }
        if (*(ulong *)(lVar2 + 0x20) < (ulong)((long)&b->peer + *(long *)(lVar2 + 0x18))) {
          local_50 = (bio_bio_st *)(*(long *)(lVar2 + 0x20) - *(long *)(lVar2 + 0x18));
        }
        else {
          local_50 = b;
        }
        if (*(ulong *)(lVar2 + 0x20) < (ulong)((long)&local_50->peer + *(long *)(lVar2 + 0x18))) {
          __assert_fail("peer_b->offset + chunk <= peer_b->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                        ,0xa6,"int bio_read(BIO *, char *, int)");
        }
        OPENSSL_memcpy(pcStack_20,(void *)(*(long *)(lVar2 + 0x28) + *(long *)(lVar2 + 0x18)),
                       (size_t)local_50);
        *(long *)(lVar2 + 0x10) = *(long *)(lVar2 + 0x10) - (long)local_50;
        if (*(long *)(lVar2 + 0x10) == 0) {
          if (local_50 != b) {
            __assert_fail("chunk == rest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0xb4,"int bio_read(BIO *, char *, int)");
          }
          *(undefined8 *)(lVar2 + 0x18) = 0;
        }
        else {
          *(long *)(lVar2 + 0x18) = (long)&local_50->peer + *(long *)(lVar2 + 0x18);
          if (*(ulong *)(lVar2 + 0x20) < *(ulong *)(lVar2 + 0x18)) {
            __assert_fail("peer_b->offset <= peer_b->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0xad,"int bio_read(BIO *, char *, int)");
          }
          if (*(long *)(lVar2 + 0x18) == *(long *)(lVar2 + 0x20)) {
            *(undefined8 *)(lVar2 + 0x18) = 0;
          }
          pcStack_20 = pcStack_20 + (long)&local_50->peer;
        }
        b = (bio_bio_st *)((long)b - (long)local_50);
      } while (b != (bio_bio_st *)0x0);
      bio_local._4_4_ = (int)rest;
    }
  }
  return bio_local._4_4_;
}

Assistant:

static int bio_read(BIO *bio, char *buf, int size_) {
  size_t size = size_;
  size_t rest;
  struct bio_bio_st *b, *peer_b;

  BIO_clear_retry_flags(bio);

  if (!bio->init) {
    return 0;
  }

  b = reinterpret_cast<bio_bio_st *>(bio->ptr);
  assert(b != NULL);
  assert(b->peer != NULL);
  peer_b = reinterpret_cast<bio_bio_st *>(b->peer->ptr);
  assert(peer_b != NULL);
  assert(peer_b->buf != NULL);

  peer_b->request = 0;  // will be set in "retry_read" situation

  if (buf == NULL || size == 0) {
    return 0;
  }

  if (peer_b->len == 0) {
    if (peer_b->closed) {
      return 0;  // writer has closed, and no data is left
    } else {
      BIO_set_retry_read(bio);  // buffer is empty
      if (size <= peer_b->size) {
        peer_b->request = size;
      } else {
        // don't ask for more than the peer can
        // deliver in one write
        peer_b->request = peer_b->size;
      }
      return -1;
    }
  }

  // we can read
  if (peer_b->len < size) {
    size = peer_b->len;
  }

  // now read "size" bytes
  rest = size;

  assert(rest > 0);
  // one or two iterations
  do {
    size_t chunk;

    assert(rest <= peer_b->len);
    if (peer_b->offset + rest <= peer_b->size) {
      chunk = rest;
    } else {
      // wrap around ring buffer
      chunk = peer_b->size - peer_b->offset;
    }
    assert(peer_b->offset + chunk <= peer_b->size);

    OPENSSL_memcpy(buf, peer_b->buf + peer_b->offset, chunk);

    peer_b->len -= chunk;
    if (peer_b->len) {
      peer_b->offset += chunk;
      assert(peer_b->offset <= peer_b->size);
      if (peer_b->offset == peer_b->size) {
        peer_b->offset = 0;
      }
      buf += chunk;
    } else {
      // buffer now empty, no need to advance "buf"
      assert(chunk == rest);
      peer_b->offset = 0;
    }
    rest -= chunk;
  } while (rest);

  // |size| is bounded by the buffer size, which fits in |int|.
  return (int)size;
}